

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::clearSubFocus
          (QGraphicsItemPrivate *this,QGraphicsItem *rootItem,QGraphicsItem *stopItem)

{
  bool bVar1;
  bool bVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItem *in_RDX;
  QGraphicsItem *in_RSI;
  long in_RDI;
  QGraphicsItem *parent;
  
  if (in_RSI == (QGraphicsItem *)0x0) {
    in_RSI = *(QGraphicsItem **)(in_RDI + 0x170);
  }
  do {
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if (pQVar3->subFocusItem != *(QGraphicsItem **)(in_RDI + 0x170)) {
      return;
    }
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    pQVar3->subFocusItem = (QGraphicsItem *)0x0;
    if ((in_RSI != in_RDX) && (bVar1 = QGraphicsItem::isAncestorOf(in_RDX,in_RSI), !bVar1)) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      (*pQVar3->_vptr_QGraphicsItemPrivate[8])();
    }
    bVar2 = QGraphicsItem::isPanel((QGraphicsItem *)0x973ae3);
    bVar1 = false;
    if (!bVar2) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      in_RSI = pQVar3->parent;
      bVar1 = in_RSI != (QGraphicsItem *)0x0;
    }
  } while (bVar1);
  return;
}

Assistant:

void QGraphicsItemPrivate::clearSubFocus(QGraphicsItem *rootItem, QGraphicsItem *stopItem)
{
    // Reset sub focus chain.
    QGraphicsItem *parent = rootItem ? rootItem : q_ptr;
    do {
        if (parent->d_ptr->subFocusItem != q_ptr)
            break;
        parent->d_ptr->subFocusItem = nullptr;
        if (parent != stopItem && !parent->isAncestorOf(stopItem))
            parent->d_ptr->subFocusItemChange();
    } while (!parent->isPanel() && (parent = parent->d_ptr->parent));
}